

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O0

void reinvert(Basis *basis,CholeskyFactor *factor,Gradient *grad,ReducedCosts *rc,
             ReducedGradient *rg,unique_ptr<Pricing,_std::default_delete<Pricing>_> *pricing)

{
  ReducedCosts *in_R9;
  Basis *unaff_retaddr;
  CholeskyFactor *in_stack_000001f0;
  
  Basis::rebuild(unaff_retaddr);
  CholeskyFactor::recompute(in_stack_000001f0);
  Gradient::recompute((Gradient *)in_R9);
  ReducedCosts::recompute(in_R9);
  ReducedGradient::recompute((ReducedGradient *)in_R9);
  return;
}

Assistant:

static void reinvert(Basis& basis, CholeskyFactor& factor, Gradient& grad,
                     ReducedCosts& rc, ReducedGradient& rg,
                     std::unique_ptr<Pricing>& pricing) {
  basis.rebuild();
  factor.recompute();
  grad.recompute();
  rc.recompute();
  rg.recompute();
  // pricing->recompute();
}